

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_multi_var
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  code *pcVar5;
  ulong uVar6;
  secp256k1_fe *rzr;
  ulong uVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong local_868;
  secp256k1_strauss_state local_860;
  secp256k1_fe aux [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n != 0) {
    if (n != 0) {
      if (scratch != (secp256k1_scratch *)0x0) {
        lVar2 = 0;
        do {
          if (scratch->magic[lVar2] != "scratch"[lVar2]) {
            (*error_callback->fn)("invalid scratch space",error_callback->data);
            uVar4 = 0;
            goto LAB_0010fdab;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
        uVar3 = scratch->max_size - scratch->alloc_size;
        uVar4 = 0;
        if (0x59 < uVar3) {
          uVar4 = uVar3 - 0x5a;
        }
LAB_0010fdab:
        uVar6 = 1;
        puVar8 = &DAT_0013a220;
        uVar3 = 0;
        do {
          if (uVar6 == 0xd) break;
          if (uVar6 < 0xd) {
            uVar9 = *puVar8;
          }
          else {
            uVar9 = 0;
          }
          uVar7 = (ulong)(byte)(0x7f / (byte)((byte)uVar6 + 1));
          uVar10 = (0x80L << ((byte)uVar6 & 0x3f)) + uVar7 * 8 + 0x130;
          if (uVar4 < uVar10) break;
          uVar10 = (uVar4 - uVar10) / (uVar7 * 8 + 0x120);
          uVar7 = uVar10;
          if (uVar9 <= uVar10) {
            uVar7 = uVar9;
          }
          if (uVar3 < uVar7) {
            uVar3 = uVar7;
          }
          puVar8 = puVar8 + 1;
          uVar6 = uVar6 + 1;
        } while (uVar9 <= uVar10);
        if (uVar3 != 0) {
          uVar4 = 5000000;
          if (uVar3 < 5000000) {
            uVar4 = uVar3;
          }
          uVar3 = n - 1;
          local_868 = uVar3 / uVar4 + 1;
          uVar4 = uVar3 / local_868;
          if (uVar4 < 0x57) {
            lVar2 = 0;
            do {
              if (scratch->magic[lVar2] != "scratch"[lVar2]) {
                (*error_callback->fn)("invalid scratch space",error_callback->data);
                goto LAB_0010ff8d;
              }
              lVar2 = lVar2 + 1;
            } while (lVar2 != 8);
            uVar6 = scratch->max_size - scratch->alloc_size;
            uVar4 = 0;
            if (0x4a < uVar6) {
              uVar4 = uVar6 - 0x4b;
            }
            if (uVar4 < 0x8b0) goto LAB_0010ff8d;
            uVar4 = uVar4 / 0x8b0;
            if (4999999 < uVar4) {
              uVar4 = 5000000;
            }
            local_868 = uVar3 / uVar4 + 1;
            uVar4 = uVar3 / local_868;
            pcVar5 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar5 = secp256k1_ecmult_pippenger_batch;
          }
          uVar4 = uVar4 + 1;
          lVar2 = 0;
          uVar3 = 0;
          while( true ) {
            uVar6 = uVar4;
            if (n < uVar4) {
              uVar6 = n;
            }
            rzr = (secp256k1_fe *)0x0;
            if (uVar3 == 0) {
              rzr = (secp256k1_fe *)inp_g_sc;
            }
            iVar1 = (*pcVar5)(error_callback,scratch,ps,rzr,cb,cbdata,uVar6,lVar2);
            if (iVar1 == 0) break;
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)ps,rzr);
            n = n - uVar6;
            uVar3 = uVar3 + 1;
            lVar2 = lVar2 + uVar4;
            if (local_868 == uVar3) {
              return 1;
            }
          }
          return 0;
        }
      }
LAB_0010ff8d:
      iVar1 = secp256k1_ecmult_multi_simple_var(r,inp_g_sc,cb,cbdata,n);
      return iVar1;
    }
    local_860.aux = aux;
    local_860.pre_a = pre_a;
    local_860.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&local_860,r,1,r,&secp256k1_scalar_zero,inp_g_sc);
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_callback* error_callback, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_ecmult(r, r, &secp256k1_scalar_zero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }

    /* Compute the batch sizes for Pippenger's algorithm given a scratch space. If it's greater than
     * a threshold use Pippenger's algorithm. Otherwise use Strauss' algorithm.
     * As a first step check if there's enough space for Pippenger's algo (which requires less space
     * than Strauss' algo) and if not, use the simple algorithm. */
    if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_pippenger_max_points(error_callback, scratch), n)) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }
    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_strauss_max_points(error_callback, scratch), n)) {
            return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
        }
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(error_callback, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}